

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

semantic_tag __thiscall
jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>::tag
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *this)

{
  json_storage_kind jVar1;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  semantic_tag local_1;
  
  jVar1 = storage_kind(in_RDI);
  if (jVar1 == json_const_reference) {
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::
    cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::json_const_reference_storage>
              (in_RDI);
    json_const_reference_storage::value((json_const_reference_storage *)0xa0d360);
    local_1 = tag((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *)
                  CONCAT17(jVar1,in_stack_ffffffffffffffe8));
  }
  else if (jVar1 == json_reference) {
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::
    cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::json_reference_storage>
              (in_RDI);
    json_reference_storage::value((json_reference_storage *)0xa0d380);
    local_1 = tag((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *)
                  CONCAT17(jVar1,in_stack_ffffffffffffffe8));
  }
  else {
    local_1 = (in_RDI->field_0).common_.tag_;
  }
  return local_1;
}

Assistant:

semantic_tag tag() const
        {
            // It is legal to access 'common_.tag_' even though 
            // common_ is not the active member of the union because 'tag_' 
            // is a part of the common initial sequence of all union members
            // as defined in 11.4-25 of the Standard.
            switch(storage_kind())
            {
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().tag();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().tag();
                default:
                    return common_.tag_;
            }
        }